

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

void __thiscall dg::vr::StructureAnalyzer::findLoops(StructureAnalyzer *this)

{
  _Rb_tree_header *p_Var1;
  VRLocation *this_00;
  VRLocation *pVVar2;
  ValueRelations *pVVar3;
  iterator __position;
  iterator __position_00;
  pointer *pppVVar4;
  char cVar5;
  bool bVar6;
  _Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>
  _Var7;
  _Link_type p_Var8;
  long lVar9;
  long lVar10;
  _Link_type p_Var11;
  long lVar12;
  _Link_type this_01;
  Function *f;
  ulong uVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>,_bool>
  pVar14;
  LazyDFS it_1;
  set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  backwardReach;
  VREdge *edge;
  LazyDFS it;
  Instruction *local_170;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> local_168;
  _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  local_110;
  VRLocation *local_e0 [2];
  _Link_type local_d0;
  pointer local_a8;
  pointer local_98;
  LazyDFS local_88;
  
  lVar10 = *(long *)(*(long *)this + 0x20);
  lVar12 = *(long *)this + 0x18;
  if (lVar10 != lVar12) {
    p_Var1 = &local_110._M_impl.super__Rb_tree_header;
    do {
      f = (Function *)(lVar10 + -0x38);
      if (lVar10 == 0) {
        f = (Function *)0x0;
      }
      cVar5 = llvm::GlobalValue::isDeclaration();
      if (cVar5 == '\0') {
        VRCodeGraph::lazy_dfs_begin(&local_88,*(VRCodeGraph **)(this + 8),f);
        while( true ) {
          VRCodeGraph::lazy_dfs_end();
          bVar6 = operator==(&local_88,&local_168);
          if (local_168.stack.
              super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.stack.
                            super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_168.stack.
                                  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.stack.
                                  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          this_01 = (_Link_type)
                    local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          std::
          _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
          ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                      *)&local_168,
                     (_Link_type)
                     local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent);
          if (bVar6) break;
          this_00 = local_88.stack.
                    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                    super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
          bVar6 = VRLocation::isJustLoopJoin(this_00);
          if (bVar6) {
            collectBackward((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                             *)&local_110,(StructureAnalyzer *)this_01,f,this_00);
            local_168.super_LazyVisit.visited._M_t._M_impl._0_8_ = (void *)0x0;
            local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                 = _S_red;
            local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
            ;
            local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 = (_Base_ptr)0x0;
            local_e0[0] = this_00;
            pVar14 = std::
                     _Rb_tree<dg::vr::VRLocation_const*,std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>,std::_Select1st<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                     ::
                     _M_emplace_unique<dg::vr::VRLocation*,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>
                               ((_Rb_tree<dg::vr::VRLocation_const*,std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>,std::_Select1st<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                                 *)(this + 0x10),local_e0,
                                (vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                                 *)&local_168);
            _Var7 = pVar14.first._M_node;
            if ((void *)local_168.super_LazyVisit.visited._M_t._M_impl._0_8_ != (void *)0x0) {
              operator_delete((void *)local_168.super_LazyVisit.visited._M_t._M_impl._0_8_,
                              (long)local_168.super_LazyVisit.visited._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent -
                              local_168.super_LazyVisit.visited._M_t._M_impl._0_8_);
            }
            VRCodeGraph::lazy_dfs_begin(&local_168,*(VRCodeGraph **)(this + 8),f,this_00);
            while( true ) {
              VRCodeGraph::lazy_dfs_end();
              bVar6 = operator==(&local_168,(DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)local_e0);
              if (local_a8 != (pointer)0x0) {
                operator_delete(local_a8,(long)local_98 - (long)local_a8);
              }
              std::
              _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
              ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                          *)local_e0,local_d0);
              if (bVar6) break;
              pVVar2 = local_168.stack.
                       super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                       super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
              p_Var8 = (_Link_type)p_Var1;
              for (p_Var11 = (_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent
                  ; p_Var11 != (_Link_type)0x0;
                  p_Var11 = *(_Link_type *)(&p_Var11->_M_storage)[(ulong)bVar6 - 2]._M_storage) {
                bVar6 = *(VRLocation **)(p_Var11->_M_storage)._M_storage < pVVar2;
                if (!bVar6) {
                  p_Var8 = p_Var11;
                }
              }
              p_Var11 = (_Link_type)p_Var1;
              if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
                 (p_Var11 = p_Var8, pVVar2 < *(VRLocation **)(p_Var8->_M_storage)._M_storage)) {
                p_Var11 = (_Link_type)p_Var1;
              }
              if ((_Rb_tree_header *)p_Var11 != p_Var1) {
                lVar9 = (long)(pVVar2->successors).
                              super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                if ((int)((ulong)((long)*(pointer *)
                                         ((long)&(pVVar2->successors).
                                                 super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                                 ._M_impl + 8) - lVar9) >> 3) != 0) {
                  uVar13 = 0;
                  do {
                    local_e0[0] = *(VRLocation **)(lVar9 + uVar13 * 8);
                    pVVar3 = (local_e0[0]->relations).graph.reported;
                    p_Var11 = (_Link_type)p_Var1;
                    p_Var8 = (_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent
                    ;
                    if (pVVar3 != (ValueRelations *)0x0) {
                      for (; p_Var8 != (_Link_type)0x0;
                          p_Var8 = *(_Link_type *)(&p_Var8->_M_storage)[(ulong)bVar6 - 2]._M_storage
                          ) {
                        bVar6 = *(ValueRelations **)(p_Var8->_M_storage)._M_storage < pVVar3;
                        if (!bVar6) {
                          p_Var11 = p_Var8;
                        }
                      }
                      p_Var8 = (_Link_type)p_Var1;
                      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
                         (p_Var8 = p_Var11,
                         pVVar3 < *(ValueRelations **)(p_Var11->_M_storage)._M_storage)) {
                        p_Var8 = (_Link_type)p_Var1;
                      }
                      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
                        __position_00._M_current =
                             *(pointer *)
                              ((long)&(this_00->loopEnds).
                                      super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                      ._M_impl + 8);
                        if (__position_00._M_current ==
                            *(pointer *)
                             ((long)&(this_00->loopEnds).
                                     super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                     ._M_impl + 0x10)) {
                          std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
                          _M_realloc_insert<dg::vr::VREdge*&>
                                    ((vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>
                                      *)&this_00->loopEnds,__position_00,(VREdge **)local_e0);
                        }
                        else {
                          *__position_00._M_current = (VREdge *)local_e0[0];
                          pppVVar4 = (pointer *)
                                     ((long)&(this_00->loopEnds).
                                             super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                             ._M_impl + 8);
                          *pppVVar4 = *pppVVar4 + 1;
                        }
                      }
                      else {
                        lVar9 = *(long *)&(local_e0[0]->relations).graph.buckets._M_t._M_impl;
                        if (*(int *)(lVar9 + 8) == 1) {
                          local_170 = *(Instruction **)(lVar9 + 0x10);
                          __position._M_current = (Instruction **)_Var7._M_node[1]._M_left;
                          if ((_Base_ptr)__position._M_current == _Var7._M_node[1]._M_right) {
                            std::
                            vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                            ::_M_realloc_insert<llvm::Instruction_const*>
                                      ((vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                                        *)&_Var7._M_node[1]._M_parent,__position,&local_170);
                          }
                          else {
                            *__position._M_current = local_170;
                            _Var7._M_node[1]._M_left =
                                 (_Base_ptr)&(_Var7._M_node[1]._M_left)->_M_parent;
                          }
                        }
                      }
                    }
                    uVar13 = uVar13 + 1;
                    lVar9 = (long)(pVVar2->successors).
                                  super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                  } while (uVar13 < ((ulong)((long)*(pointer *)
                                                    ((long)&(pVVar2->successors).
                                                                                                                        
                                                  super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                                  ._M_impl + 8) - lVar9) >> 3 & 0xffffffff));
                }
                if ((pVVar2 != this_00) &&
                   ((pVVar2->join == (VRLocation *)0x0 || (this_00->join != (VRLocation *)0x0)))) {
                  pVVar2->join = this_00;
                }
              }
              VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(&local_168);
            }
            if (local_168.stack.
                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_168.stack.
                              super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_168.stack.
                                    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168.stack.
                                    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
            ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                        *)&local_168,
                       (_Link_type)
                       local_168.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_parent);
            std::
            _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
            ::_M_erase(&local_110,
                       (_Link_type)local_110._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(&local_88);
        }
        if (local_88.stack.
            super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.stack.
                          super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
        ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_std::pair<dg::vr::VRLocation_*const,_unsigned_int>,_std::_Select1st<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>,_std::less<dg::vr::VRLocation_*>,_std::allocator<std::pair<dg::vr::VRLocation_*const,_unsigned_int>_>_>
                    *)&local_88,
                   (_Link_type)
                   local_88.super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent);
      }
      lVar10 = *(long *)(lVar10 + 8);
    } while (lVar10 != lVar12);
  }
  return;
}

Assistant:

void StructureAnalyzer::findLoops() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.lazy_dfs_begin(function);
             it != codeGraph.lazy_dfs_end(); ++it) {
            VRLocation &location = *it;

            if (!location.isJustLoopJoin())
                continue;

            auto backwardReach = collectBackward(function, location);

            auto &loop =
                    inloopValues
                            .emplace(&location,
                                     std::vector<const llvm::Instruction *>())
                            .first->second;

            for (auto it = codeGraph.lazy_dfs_begin(function, location);
                 it != codeGraph.lazy_dfs_end(); ++it) {
                VRLocation &source = *it;

                if (backwardReach.find(&source) == backwardReach.end())
                    continue;

                for (size_t i = 0; i < source.succsSize(); ++i) {
                    VREdge *edge = source.getSuccEdge(i);
                    if (!edge->target)
                        continue;

                    if (backwardReach.find(edge->target) !=
                        backwardReach.end()) {
                        if (edge->op->isInstruction()) {
                            auto *op = static_cast<VRInstruction *>(
                                    edge->op.get());
                            loop.emplace_back(op->getInstruction());
                        }
                    } else
                        location.loopEnds.emplace_back(edge);
                }

                if (&source != &location && (!source.join || location.join))
                    source.join = &location;
            }
        }
    }
}